

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_set_ge(secp256k1_gej *r,secp256k1_ge *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  
  secp256k1_ge_verify(a);
  r->infinity = a->infinity;
  uVar1 = (a->x).n[1];
  uVar2 = (a->x).n[2];
  uVar3 = (a->x).n[3];
  uVar4 = (a->x).n[4];
  iVar5 = (a->x).magnitude;
  iVar6 = (a->x).normalized;
  (r->x).n[0] = (a->x).n[0];
  (r->x).n[1] = uVar1;
  (r->x).n[2] = uVar2;
  (r->x).n[3] = uVar3;
  (r->x).n[4] = uVar4;
  (r->x).magnitude = iVar5;
  (r->x).normalized = iVar6;
  uVar1 = (a->y).n[1];
  uVar2 = (a->y).n[2];
  uVar3 = (a->y).n[3];
  uVar4 = (a->y).n[4];
  iVar5 = (a->y).magnitude;
  iVar6 = (a->y).normalized;
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar1;
  (r->y).n[2] = uVar2;
  (r->y).n[3] = uVar3;
  (r->y).n[4] = uVar4;
  (r->y).magnitude = iVar5;
  (r->y).normalized = iVar6;
  (r->z).n[0] = 1;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  (r->z).magnitude = 1;
  (r->z).normalized = 1;
  secp256k1_fe_verify(&r->z);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_set_ge(secp256k1_gej *r, const secp256k1_ge *a) {
   SECP256K1_GE_VERIFY(a);

   r->infinity = a->infinity;
   r->x = a->x;
   r->y = a->y;
   secp256k1_fe_set_int(&r->z, 1);

   SECP256K1_GEJ_VERIFY(r);
}